

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O2

void destroy_message_receiver(AMQP_MESSENGER_INSTANCE_conflict *instance)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  
  if (instance->message_receiver != (MESSAGE_RECEIVER_HANDLE)0x0) {
    iVar1 = messagereceiver_close(instance->message_receiver);
    if (iVar1 != 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                  ,"destroy_message_receiver",0x2a5,1,
                  "Failed closing the AMQP message receiver (this failure will be ignored).");
      }
    }
    messagereceiver_destroy(instance->message_receiver);
    instance->message_receiver = (MESSAGE_RECEIVER_HANDLE)0x0;
  }
  instance->message_receiver_current_state = MESSAGE_RECEIVER_STATE_IDLE;
  instance->message_receiver_previous_state = MESSAGE_RECEIVER_STATE_IDLE;
  instance->last_message_receiver_state_change_time = -1;
  if (instance->receiver_link != (LINK_HANDLE)0x0) {
    link_destroy(instance->receiver_link);
    instance->receiver_link = (LINK_HANDLE)0x0;
  }
  return;
}

Assistant:

static void destroy_message_receiver(AMQP_MESSENGER_INSTANCE* instance)
{
    if (instance->message_receiver != NULL)
    {
        if (messagereceiver_close(instance->message_receiver) != RESULT_OK)
        {
            LogError("Failed closing the AMQP message receiver (this failure will be ignored).");
        }

        messagereceiver_destroy(instance->message_receiver);

        instance->message_receiver = NULL;
    }

    instance->message_receiver_current_state = MESSAGE_RECEIVER_STATE_IDLE;
    instance->message_receiver_previous_state = MESSAGE_RECEIVER_STATE_IDLE;
    instance->last_message_receiver_state_change_time = INDEFINITE_TIME;

    if (instance->receiver_link != NULL)
    {
        link_destroy(instance->receiver_link);
        instance->receiver_link = NULL;
    }
}